

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall CommandDrawImage::Parse(CommandDrawImage *this,FScanner *sc,bool fullScreenOffsets)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  PClass *ti;
  AActor *pAVar4;
  PClass *item;
  bool getImage;
  bool parenthesized;
  bool fullScreenOffsets_local;
  FScanner *sc_local;
  CommandDrawImage *this_local;
  
  item._6_1_ = false;
  bVar2 = true;
  bVar1 = FScanner::CheckToken(sc,0x101);
  if (bVar1) {
    bVar2 = false;
    bVar1 = FScanner::Compare(sc,"playericon");
    if (bVar1) {
      *(undefined4 *)&(this->super_SBarInfoCommandFlowControl).field_0x34 = 0;
    }
    else {
      bVar1 = FScanner::Compare(sc,"ammoicon1");
      if (bVar1) {
        *(undefined4 *)&(this->super_SBarInfoCommandFlowControl).field_0x34 = 1;
      }
      else {
        bVar1 = FScanner::Compare(sc,"ammoicon2");
        if (bVar1) {
          *(undefined4 *)&(this->super_SBarInfoCommandFlowControl).field_0x34 = 2;
        }
        else {
          bVar1 = FScanner::Compare(sc,"armoricon");
          if (bVar1) {
            *(undefined4 *)&(this->super_SBarInfoCommandFlowControl).field_0x34 = 3;
          }
          else {
            bVar1 = FScanner::Compare(sc,"weaponicon");
            if (bVar1) {
              *(undefined4 *)&(this->super_SBarInfoCommandFlowControl).field_0x34 = 4;
            }
            else {
              bVar1 = FScanner::Compare(sc,"sigil");
              if (bVar1) {
                *(undefined4 *)&(this->super_SBarInfoCommandFlowControl).field_0x34 = 5;
              }
              else {
                bVar1 = FScanner::Compare(sc,"hexenarmor");
                if (bVar1) {
                  item._6_1_ = FScanner::CheckToken(sc,0x28);
                  FScanner::MustGetToken(sc,0x101);
                  bVar2 = FScanner::Compare(sc,"armor");
                  if (bVar2) {
                    *(undefined4 *)&(this->super_SBarInfoCommandFlowControl).field_0x34 = 6;
                  }
                  else {
                    bVar2 = FScanner::Compare(sc,"shield");
                    if (bVar2) {
                      *(undefined4 *)&(this->super_SBarInfoCommandFlowControl).field_0x34 = 7;
                    }
                    else {
                      bVar2 = FScanner::Compare(sc,"helm");
                      if (bVar2) {
                        *(undefined4 *)&(this->super_SBarInfoCommandFlowControl).field_0x34 = 8;
                      }
                      else {
                        bVar2 = FScanner::Compare(sc,"amulet");
                        if (bVar2) {
                          *(undefined4 *)&(this->super_SBarInfoCommandFlowControl).field_0x34 = 9;
                        }
                        else {
                          FScanner::ScriptMessage(sc,"Unknown armor type: \'%s\'",sc->String);
                          *(undefined4 *)&(this->super_SBarInfoCommandFlowControl).field_0x34 = 6;
                        }
                      }
                    }
                  }
                  FScanner::MustGetToken(sc,0x2c);
                  bVar2 = true;
                }
                else {
                  bVar1 = FScanner::Compare(sc,"translatable");
                  if (bVar1) {
                    (this->super_SBarInfoCommandFlowControl).field_0x31 = 1;
                    bVar2 = true;
                  }
                  else {
                    *(undefined4 *)&(this->super_SBarInfoCommandFlowControl).field_0x34 = 10;
                    ti = PClass::FindClass(sc->String);
                    if ((ti == (PClass *)0x0) ||
                       (bVar1 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,ti),
                       !bVar1)) {
                      FScanner::ScriptMessage
                                (sc,"\'%s\' is not a type of inventory item.",sc->String);
                    }
                    else {
                      pAVar4 = GetDefaultByType(ti);
                      (this->sprite).texnum = *(int *)&pAVar4[1].super_DThinker.super_DObject.GCNext
                      ;
                    }
                    this->image = -1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (bVar2) {
    FScanner::MustGetToken(sc,0x102);
    iVar3 = SBarInfo::newImage((this->super_SBarInfoCommandFlowControl).super_SBarInfoCommand.script
                               ,sc->String);
    this->image = iVar3;
    FTextureID::SetInvalid(&this->sprite);
    if (item._6_1_ != false) {
      FScanner::MustGetToken(sc,0x29);
    }
  }
  FScanner::MustGetToken(sc,0x2c);
  SBarInfoCommand::GetCoordinates
            ((SBarInfoCommand *)this,sc,fullScreenOffsets,&this->imgx,&this->imgy);
  bVar2 = FScanner::CheckToken(sc,0x2c);
  if ((bVar2) && (bVar2 = FScanner::CheckToken(sc,0x14d), !bVar2)) {
    FScanner::MustGetToken(sc,0x101);
    bVar2 = FScanner::Compare(sc,"center");
    if (bVar2) {
      this->offset = CENTER;
    }
    else {
      bVar2 = FScanner::Compare(sc,"centerbottom");
      if (bVar2) {
        this->offset = CENTER_BOTTOM;
      }
      else {
        FScanner::ScriptError(sc,"\'%s\' is not a valid alignment.",sc->String);
      }
    }
  }
  bVar2 = FScanner::CheckToken(sc,0x2c);
  if (bVar2) {
    FScanner::MustGetToken(sc,0x104);
    iVar3 = sc->Number;
    this->maxwidth = iVar3;
    if (iVar3 < 1) {
      this->maxwidth = -1;
    }
    else {
      this->flags = this->flags | 0x20;
    }
    FScanner::MustGetToken(sc,0x2c);
    FScanner::MustGetToken(sc,0x104);
    iVar3 = sc->Number;
    this->maxheight = iVar3;
    if (iVar3 < 1) {
      this->maxheight = -1;
    }
    else {
      this->flags = this->flags | 0x20;
    }
  }
  bVar2 = FScanner::CheckToken(sc,0x2c);
  if (bVar2) {
    do {
      bVar2 = FScanner::CheckToken(sc,0x101);
      if (!bVar2) break;
      bVar2 = FScanner::Compare(sc,"skipicon");
      if (bVar2) {
        this->flags = this->flags | 1;
      }
      else {
        bVar2 = FScanner::Compare(sc,"skipalticon");
        if (bVar2) {
          this->flags = this->flags | 2;
        }
        else {
          bVar2 = FScanner::Compare(sc,"skipspawn");
          if (bVar2) {
            this->flags = this->flags | 4;
          }
          else {
            bVar2 = FScanner::Compare(sc,"skipready");
            if (bVar2) {
              this->flags = this->flags | 8;
            }
            else {
              bVar2 = FScanner::Compare(sc,"alticonfirst");
              if (bVar2) {
                this->flags = this->flags | 0x10;
              }
              else {
                bVar2 = FScanner::Compare(sc,"forcescale");
                if (bVar2) {
                  if ((this->flags & 0x20) != 0) {
                    this->flags = this->flags | 0x40;
                  }
                }
                else {
                  bVar2 = FScanner::Compare(sc,"alternateonfail");
                  if (bVar2) {
                    this->flags = this->flags | 0x80;
                  }
                  else {
                    FScanner::ScriptError(sc,"Unknown flag \'%s\'.",sc->String);
                  }
                }
              }
            }
          }
        }
      }
      bVar2 = FScanner::CheckToken(sc,0x7c);
    } while ((bVar2) || (bVar2 = FScanner::CheckToken(sc,0x2c), bVar2));
  }
  if ((this->flags & 0x80) == 0) {
    FScanner::MustGetToken(sc,0x3b);
  }
  else {
    SBarInfoCommandFlowControl::Parse(&this->super_SBarInfoCommandFlowControl,sc,fullScreenOffsets);
  }
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			bool parenthesized = false;
			bool getImage = true;
			if(sc.CheckToken(TK_Identifier))
			{
				getImage = false;
				if(sc.Compare("playericon"))
					type = PLAYERICON;
				else if(sc.Compare("ammoicon1"))
					type = AMMO1;
				else if(sc.Compare("ammoicon2"))
					type = AMMO2;
				else if(sc.Compare("armoricon"))
					type = ARMOR;
				else if(sc.Compare("weaponicon"))
					type = WEAPONICON;
				else if(sc.Compare("sigil"))
					type = SIGIL;
				else if(sc.Compare("hexenarmor"))
				{
					parenthesized = sc.CheckToken('(');

					sc.MustGetToken(TK_Identifier);
					if(sc.Compare("armor"))
						type = HEXENARMOR_ARMOR;
					else if(sc.Compare("shield"))
						type = HEXENARMOR_SHIELD;
					else if(sc.Compare("helm"))
						type = HEXENARMOR_HELM;
					else if(sc.Compare("amulet"))
						type = HEXENARMOR_AMULET;
					else
					{
						sc.ScriptMessage("Unknown armor type: '%s'", sc.String);
						type = HEXENARMOR_ARMOR;
					}
					sc.MustGetToken(',');
					getImage = true;
				}
				else if(sc.Compare("translatable"))
				{
					translatable = true;
					getImage = true;
				}
				else
				{
					type = INVENTORYICON;
					const PClass* item = PClass::FindClass(sc.String);
					if(item == NULL || !RUNTIME_CLASS(AInventory)->IsAncestorOf(item)) //must be a kind of Inventory
					{
						sc.ScriptMessage("'%s' is not a type of inventory item.", sc.String);
					}
					else
					{
						sprite = ((AInventory *)GetDefaultByType(item))->Icon;
					}
					image = -1;
				}
			}
			if(getImage)
			{
				sc.MustGetToken(TK_StringConst);
				image = script->newImage(sc.String);
				sprite.SetInvalid();

				if(parenthesized) sc.MustGetToken(')');
			}
			sc.MustGetToken(',');
			GetCoordinates(sc, fullScreenOffsets, imgx, imgy);
			if(sc.CheckToken(','))
			{
				// Use none instead of topleft in case we decide we want to use
				// alignments to remove the offset from images.
				if(!sc.CheckToken(TK_None))
				{
					sc.MustGetToken(TK_Identifier);
					if(sc.Compare("center"))
						offset = CENTER;
					else if(sc.Compare("centerbottom"))
						offset = static_cast<Offset> (HMIDDLE|BOTTOM);
					else
						sc.ScriptError("'%s' is not a valid alignment.", sc.String);
				}
			}
			if(sc.CheckToken(','))
			{
				sc.MustGetToken(TK_IntConst);
				if((maxwidth = sc.Number) > 0)
					flags |= DI_DRAWINBOX;
				else
					maxwidth = -1;
				sc.MustGetToken(',');
				sc.MustGetToken(TK_IntConst);
				if ((maxheight = sc.Number) > 0)
					flags |= DI_DRAWINBOX;
				else
					maxheight = -1;
			}
			if(sc.CheckToken(','))
			{
				while(sc.CheckToken(TK_Identifier))
				{
					if(sc.Compare("skipicon"))
						flags |= DI_SKIPICON;
					else if(sc.Compare("skipalticon"))
						flags |= DI_SKIPALTICON;
					else if(sc.Compare("skipspawn"))
						flags |= DI_SKIPSPAWN;
					else if(sc.Compare("skipready"))
						flags |= DI_SKIPREADY;
					else if(sc.Compare("alticonfirst"))
						flags |= DI_ALTICONFIRST;
					else if(sc.Compare("forcescale"))
					{
						if(flags & DI_DRAWINBOX)
							flags |= DI_FORCESCALE;
					}
					else if(sc.Compare("alternateonfail"))
						flags |= DI_ALTERNATEONFAIL;
					else
						sc.ScriptError("Unknown flag '%s'.", sc.String);
					if(!sc.CheckToken('|') && !sc.CheckToken(',')) break;
				}
			}
			if(flags & DI_ALTERNATEONFAIL)
				SBarInfoCommandFlowControl::Parse(sc, fullScreenOffsets);
			else
				sc.MustGetToken(';');
		}